

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_csv_parser.cpp
# Opt level: O3

void __thiscall csv::internals::IBasicCSVParser::end_feed(IBasicCSVParser *this)

{
  ParseFlags PVar1;
  element_type *peVar2;
  size_t sVar3;
  bool bVar4;
  
  peVar2 = (this->data_ptr).
           super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (((peVar2 == (element_type *)0x0) ||
      ((peVar2->_data).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
       (element_type *)0x0)) || (sVar3 = (peVar2->data)._M_len, sVar3 == 0)) {
    bVar4 = false;
LAB_0010b35b:
    if ((!bVar4) && (this->field_length == 0)) goto LAB_0010b36e;
  }
  else {
    PVar1 = (this->_parse_flags)._M_elems[(long)(peVar2->data)._M_str[sVar3 - 1] + 0x80];
    if (PVar1 != DELIMITER) {
      bVar4 = PVar1 == QUOTE;
      goto LAB_0010b35b;
    }
  }
  push_field(this);
LAB_0010b36e:
  if ((this->current_row).row_length != 0) {
    sVar3 = CSVFieldList::size(this->fields);
    (this->current_row).row_length = sVar3 - (this->current_row).fields_start;
    ThreadSafeDeque<csv::CSVRow>::push_back(this->_records,&this->current_row);
    return;
  }
  return;
}

Assistant:

CSV_INLINE void IBasicCSVParser::end_feed() {
            using internals::ParseFlags;

            bool empty_last_field = this->data_ptr
                && this->data_ptr->_data
                && !this->data_ptr->data.empty()
                && (parse_flag(this->data_ptr->data.back()) == ParseFlags::DELIMITER
                    || parse_flag(this->data_ptr->data.back()) == ParseFlags::QUOTE);

            // Push field
            if (this->field_length > 0 || empty_last_field) {
                this->push_field();
            }

            // Push row
            if (this->current_row.size() > 0)
                this->push_row();
        }